

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

void __thiscall icu_63::OffsetList::shift(OffsetList *this,int32_t delta)

{
  int iVar1;
  int iVar2;
  
  iVar2 = delta + this->start;
  iVar1 = 0;
  if (this->capacity <= iVar2) {
    iVar1 = this->capacity;
  }
  iVar2 = iVar2 - iVar1;
  if (this->list[iVar2] != '\0') {
    this->list[iVar2] = '\0';
    this->length = this->length + -1;
  }
  this->start = iVar2;
  return;
}

Assistant:

void shift(int32_t delta) {
        int32_t i=start+delta;
        if(i>=capacity) {
            i-=capacity;
        }
        if(list[i]) {
            list[i]=FALSE;
            --length;
        }
        start=i;
    }